

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unload.c
# Opt level: O0

void destroy_signal(DUH_SIGNAL *signal)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (((in_RDI[1] != 0) && (*(long *)(in_RDI[1] + 0x38) != 0)) && (*in_RDI != 0)) {
      (**(code **)(in_RDI[1] + 0x38))(*in_RDI);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

static void destroy_signal(DUH_SIGNAL *signal)
{
	if (signal) {
		if (signal->desc)
			if (signal->desc->unload_sigdata)
				if (signal->sigdata)
					(*signal->desc->unload_sigdata)(signal->sigdata);

		free(signal);
	}
}